

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server-ws.c
# Opt level: O0

int handshake_0405(lws_context *context,lws *wsi)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uchar *buf;
  uchar *puVar5;
  lws_http_mount *plVar6;
  int iVar7;
  lws_http_mount *hit;
  int uri_len;
  char *uri_ptr;
  char *prot;
  char *p;
  char *response;
  int accept_len;
  int n;
  uchar hash [20];
  lws_process_html_args args;
  lws_context_per_thread *pt;
  lws *wsi_local;
  lws_context *context_local;
  
  iVar7 = (int)wsi->tsi;
  iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_HOST);
  if ((iVar1 == 0) || (iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_KEY), iVar1 == 0)) {
    _lws_log(8,"handshake_04 missing pieces\n");
  }
  else {
    iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_KEY);
    if (iVar1 < 0x80) {
      puVar5 = context->pt[iVar7].serv_buf;
      pcVar4 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_KEY);
      uVar2 = sprintf((char *)puVar5,"%s258EAFA5-E914-47DA-95CA-C5AB0DC85B11",pcVar4);
      lws_SHA1(context->pt[iVar7].serv_buf,(ulong)uVar2,(uchar *)&accept_len);
      iVar1 = lws_b64_encode_string
                        ((char *)&accept_len,0x14,(char *)context->pt[iVar7].serv_buf,
                         context->pt_serv_buf_size);
      if (iVar1 < 0) {
        _lws_log(2,"Base64 encoded hash too long\n");
      }
      else {
        iVar3 = lws_ensure_user_space(wsi);
        if (iVar3 == 0) {
          puVar5 = context->pt[iVar7].serv_buf;
          buf = puVar5 + 400;
          strcpy((char *)buf,
                 "HTTP/1.1 101 Switching Protocols\r\nUpgrade: WebSocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
                );
          puVar5 = puVar5 + 0x1f1;
          strcpy((char *)puVar5,(char *)context->pt[iVar7].serv_buf);
          prot = (char *)(puVar5 + iVar1);
          iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_PROTOCOL);
          if (((iVar1 != 0) && (((wsi->a).protocol)->name != (char *)0x0)) &&
             (*((wsi->a).protocol)->name != '\0')) {
            pcVar4 = ((wsi->a).protocol)->name;
            strcpy(prot,"\r\nSec-WebSocket-Protocol: ");
            iVar1 = lws_snprintf((char *)((uchar *)prot + 0x1a),0x80,"%s",pcVar4);
            prot = (char *)((uchar *)prot + 0x1a + iVar1);
          }
          strcpy(prot,"\r\n");
          register0x00000000 = prot + 2;
          iVar1 = user_callback_handle_rxflow
                            (((wsi->a).protocol)->callback,wsi,LWS_CALLBACK_ADD_HEADERS,
                             wsi->user_space,hash + 0x10,0);
          pcVar4 = stack0xffffffffffffffc0;
          if (iVar1 == 0) {
            strcpy(stack0xffffffffffffffc0,"\r\n");
            iVar1 = (int)(pcVar4 + 2);
            _lws_log(0x20,"issuing resp pkt %d len\n",(ulong)(uint)(iVar1 - (int)buf));
            uVar2 = lws_write(wsi,buf,(long)(pcVar4 + 2) - (long)buf,LWS_WRITE_HTTP_HEADERS);
            if (uVar2 == iVar1 - (int)buf) {
              lwsi_set_state(wsi,0x119);
              wsi->lws_rx_parse_state = '\0';
              pcVar4 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_GET_URI);
              iVar1 = lws_hdr_total_length(wsi,WSI_TOKEN_GET_URI);
              plVar6 = lws_find_mount(wsi,pcVar4,iVar1);
              if (((plVar6 != (lws_http_mount *)0x0) &&
                  (plVar6->cgienv != (lws_protocol_vhost_options *)0x0)) &&
                 (iVar1 = (*((wsi->a).protocol)->callback)
                                    (wsi,LWS_CALLBACK_HTTP_PMO,wsi->user_space,plVar6->cgienv,0),
                 iVar1 != 0)) {
                return 1;
              }
              return 0;
            }
            _lws_log(8,"%s: ERROR writing to socket %d\n","handshake_0405",(ulong)uVar2);
          }
        }
      }
    }
    else {
      _lws_log(2,"Client key too long %d\n",0x80);
    }
  }
  return -1;
}

Assistant:

int
handshake_0405(struct lws_context *context, struct lws *wsi)
{
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	struct lws_process_html_args args;
	unsigned char hash[20];
	int n, accept_len;
	char *response;
	char *p;

	if (!lws_hdr_total_length(wsi, WSI_TOKEN_HOST) ||
	    !lws_hdr_total_length(wsi, WSI_TOKEN_KEY)) {
		lwsl_info("handshake_04 missing pieces\n");
		/* completed header processing, but missing some bits */
		goto bail;
	}

	if (lws_hdr_total_length(wsi, WSI_TOKEN_KEY) >=
	    MAX_WEBSOCKET_04_KEY_LEN) {
		lwsl_warn("Client key too long %d\n", MAX_WEBSOCKET_04_KEY_LEN);
		goto bail;
	}

	/*
	 * since key length is restricted above (currently 128), cannot
	 * overflow
	 */
	n = sprintf((char *)pt->serv_buf,
		    "%s258EAFA5-E914-47DA-95CA-C5AB0DC85B11",
		    lws_hdr_simple_ptr(wsi, WSI_TOKEN_KEY));

	lws_SHA1(pt->serv_buf, (unsigned int)n, hash);

	accept_len = lws_b64_encode_string((char *)hash, 20,
			(char *)pt->serv_buf, (int)context->pt_serv_buf_size);
	if (accept_len < 0) {
		lwsl_warn("Base64 encoded hash too long\n");
		goto bail;
	}

	/* allocate the per-connection user memory (if any) */
	if (lws_ensure_user_space(wsi))
		goto bail;

	/* create the response packet */

	/* make a buffer big enough for everything */

	response = (char *)pt->serv_buf + MAX_WEBSOCKET_04_KEY_LEN +
		   256 + LWS_PRE;
	p = response;
	LWS_CPYAPP(p, "HTTP/1.1 101 Switching Protocols\x0d\x0a"
		      "Upgrade: WebSocket\x0d\x0a"
		      "Connection: Upgrade\x0d\x0a"
		      "Sec-WebSocket-Accept: ");
	strcpy(p, (char *)pt->serv_buf);
	p += accept_len;

	/* we can only return the protocol header if:
	 *  - one came in, and ... */
	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
	    /*  - it is not an empty string */
	    wsi->a.protocol->name &&
	    wsi->a.protocol->name[0]) {
		const char *prot = wsi->a.protocol->name;

#if defined(LWS_WITH_HTTP_PROXY)
		if (wsi->proxied_ws_parent && wsi->child_list)
			prot = wsi->child_list->ws->actual_protocol;
#endif

#if defined(LWS_WITH_SECURE_STREAMS) && defined(LWS_WITH_SERVER)
		{
			lws_ss_handle_t *sssh = wsi->a.vhost->ss_handle;

			/*
			 * At the moment, once we see it's a ss ws server, whatever
			 * he asked for we bind him to the ss-ws protocol handler.
			 *
			 * In the response subprotocol header, we need to name
			 *
			 * sssh->policy->u.http.u.ws.subprotocol
			 *
			 * though...
			 */

			if (sssh && sssh->policy &&
			    sssh->policy->u.http.u.ws.subprotocol)
				prot = sssh->policy->u.http.u.ws.subprotocol;
		}
#endif

		LWS_CPYAPP(p, "\x0d\x0aSec-WebSocket-Protocol: ");
		p += lws_snprintf(p, 128, "%s", prot);
	}

#if !defined(LWS_WITHOUT_EXTENSIONS)
	/*
	 * Figure out which extensions the client has that we want to
	 * enable on this connection, and give him back the list.
	 *
	 * Give him a limited write bugdet
	 */
	if (lws_extension_server_handshake(wsi, &p, 192))
		goto bail;
#endif
	LWS_CPYAPP(p, "\x0d\x0a");

	args.p = p;
	args.max_len = lws_ptr_diff((char *)pt->serv_buf +
				    context->pt_serv_buf_size, p);
	if (user_callback_handle_rxflow(wsi->a.protocol->callback, wsi,
					LWS_CALLBACK_ADD_HEADERS,
					wsi->user_space, &args, 0))
		goto bail;

	p = args.p;

	/* end of response packet */

	LWS_CPYAPP(p, "\x0d\x0a");

	/* okay send the handshake response accepting the connection */

	lwsl_parser("issuing resp pkt %d len\n",
		    lws_ptr_diff(p, response));
#if defined(DEBUG)
	fwrite(response, 1,  p - response, stderr);
#endif
	n = lws_write(wsi, (unsigned char *)response, lws_ptr_diff_size_t(p, response),
		      LWS_WRITE_HTTP_HEADERS);
	if (n != lws_ptr_diff(p, response)) {
		lwsl_info("%s: ERROR writing to socket %d\n", __func__, n);
		goto bail;
	}

	/* alright clean up and set ourselves into established state */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = LWS_RXPS_NEW;

	{
		const char * uri_ptr =
			lws_hdr_simple_ptr(wsi, WSI_TOKEN_GET_URI);
		int uri_len = lws_hdr_total_length(wsi, WSI_TOKEN_GET_URI);
		const struct lws_http_mount *hit =
			lws_find_mount(wsi, uri_ptr, uri_len);
		if (hit && hit->cgienv &&
		    wsi->a.protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO,
			wsi->user_space, (void *)hit->cgienv, 0))
			return 1;
	}

	return 0;

bail:
	/* caller will free up his parsing allocations */
	return -1;
}